

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MPEG2.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::MPEG2::MXFReader::h__Reader::ReadFrameGOPStart
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  int iVar1;
  undefined4 in_register_00000034;
  undefined1 local_b8 [132];
  ui32_t KeyFrameNum;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  ui64_t uStack_18;
  ui32_t FrameNum_local;
  h__Reader *this_local;
  Result_t *result;
  
  uStack_18 = CONCAT44(in_register_00000034,FrameNum);
  FrameBuf_local._4_4_ = SUB84(FrameBuf,0);
  local_b8[0x7b] = 0;
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  this_local = this;
  FindFrameGOPStart(this,FrameNum,(ui32_t *)((ulong)FrameBuf & 0xffffffff));
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    ReadFrame((h__Reader *)local_b8,FrameNum,(FrameBuffer *)(ulong)(uint)local_b8._124_4_,Ctx_local,
              HMAC_local);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b8);
    Kumu::Result_t::~Result_t((Result_t *)local_b8);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MPEG2::MXFReader::h__Reader::ReadFrameGOPStart(ui32_t FrameNum, FrameBuffer& FrameBuf,
						      AESDecContext* Ctx, HMACContext* HMAC)
{
  ui32_t KeyFrameNum;

  Result_t result = FindFrameGOPStart(FrameNum, KeyFrameNum);

  if ( ASDCP_SUCCESS(result) )
    result = ReadFrame(KeyFrameNum, FrameBuf, Ctx, HMAC);

  return result;
}